

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

ValidateXrHandleResult VerifyXrPassthroughLayerFBHandle(XrPassthroughLayerFB *handle_to_check)

{
  ValidateXrHandleResult VVar1;
  XrPassthroughLayerFB *handle_to_check_local;
  
  VVar1 = HandleInfoBase<XrPassthroughLayerFB_T_*,_GenValidUsageXrHandleInfo>::verifyHandle
                    (&g_passthroughlayerfb_info.
                      super_HandleInfoBase<XrPassthroughLayerFB_T_*,_GenValidUsageXrHandleInfo>,
                     handle_to_check);
  return VVar1;
}

Assistant:

ValidateXrHandleResult VerifyXrPassthroughLayerFBHandle(const XrPassthroughLayerFB* handle_to_check) {
    return g_passthroughlayerfb_info.verifyHandle(handle_to_check);
}